

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

void __thiscall
capnp::LocalClient::LocalClient(LocalClient *this,Own<capnp::Capability::Server> *serverParam)

{
  Own<capnp::Capability::Server> *other;
  Server *pSVar1;
  Own<capnp::Capability::Server> *serverParam_local;
  LocalClient *this_local;
  
  ClientHook::ClientHook(&this->super_ClientHook);
  kj::Refcounted::Refcounted(&this->super_Refcounted);
  (this->super_ClientHook)._vptr_ClientHook = (_func_int **)&PTR_newCall_005d0378;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&DAT_005d03d0;
  other = kj::mv<kj::Own<capnp::Capability::Server>>(serverParam);
  kj::Own<capnp::Capability::Server>::Own(&this->server,other);
  this->capServerSet = (CapabilityServerSetBase *)0x0;
  this->ptr = (void *)0x0;
  pSVar1 = kj::Own<capnp::Capability::Server>::operator->(&this->server);
  pSVar1->thisHook = &this->super_ClientHook;
  return;
}

Assistant:

LocalClient(kj::Own<Capability::Server>&& serverParam)
      : server(kj::mv(serverParam)) {
    server->thisHook = this;
  }